

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

uint8_t get_mask(int field)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint8_t uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint in_ECX;
  ulong uVar9;
  uint8_t *puVar10;
  m256v *pmVar11;
  uint extraout_EDX;
  m256v *M;
  m256v *M_00;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  uint in_ESI;
  int *cp;
  uint8_t *memory;
  uint8_t *puVar15;
  int *inverted_out;
  m256v mStack_170;
  m256v mStack_158;
  m256v mStack_140;
  m256v mStack_128;
  m256v mStack_110;
  m256v mStack_f8;
  uint8_t *puStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  undefined8 uStack_a8;
  int *piStack_a0;
  int *piStack_98;
  uint8_t *puStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  undefined1 *puStack_70;
  ulong uStack_68;
  uint uStack_5c;
  ulong uStack_58;
  int iStack_4c;
  ulong uStack_48;
  uint uStack_3c;
  
  uVar5 = '\x01';
  if (field != 2) {
    if (field != 0x100) {
      get_mask_cold_1();
      uVar13 = (ulong)extraout_EDX;
      uStack_5c = in_ECX;
      bVar6 = get_mask(in_ECX);
      uVar9 = (ulong)(extraout_EDX * in_ESI);
      uStack_88 = (ulong)extraout_EDX;
      if ((int)extraout_EDX < (int)in_ESI) {
        uStack_88 = (ulong)in_ESI;
      }
      if (field == 0) {
        uStack_88 = (ulong)extraout_EDX;
      }
      uStack_d0 = (ulong)(uint)((int)uStack_88 * 8);
      uStack_c8 = (ulong)(in_ESI * 8);
      uStack_c0 = (ulong)in_ESI;
      uStack_a8 = 0;
      uStack_80 = uVar9 + 0xf & 0xfffffffffffffff0;
      uStack_b8 = uStack_d0 + 0xf & 0xfffffffffffffff0;
      uStack_78 = uStack_c8 + 0xf & 0xfffffffffffffff0;
      uStack_b0 = (ulong)extraout_EDX * 4 + 0xf & 0xfffffffffffffff0;
      uStack_68 = 0;
      pmVar11 = &mStack_170;
      uStack_58 = uVar9;
      iStack_4c = field;
      uStack_48 = (ulong)in_ESI;
      uStack_3c = extraout_EDX;
      while( true ) {
        lVar1 = -uStack_80;
        puVar15 = (uint8_t *)((long)pmVar11 + lVar1);
        puStack_70 = (undefined1 *)pmVar11;
        if (0 < (int)uVar9) {
          uVar12 = 0;
          do {
            builtin_memcpy((uint8_t *)((long)pmVar11 + lVar1 + -8),"p\x1a\x10",4);
            puVar15[-4] = '\0';
            puVar15[-3] = '\0';
            puVar15[-2] = '\0';
            puVar15[-1] = '\0';
            iVar7 = rand();
            puVar15[uVar12] = (byte)iVar7 & bVar6;
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
        }
        uVar9 = uStack_48;
        puVar15[-8] = 0x95;
        puVar15[-7] = '\x1a';
        puVar15[-6] = '\x10';
        puVar15[-5] = '\0';
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        m256v_make(&mStack_128,(int)uVar9,(int)uVar13,puVar15);
        uVar9 = uStack_d0;
        lVar2 = -uStack_b8;
        memory = puVar15 + lVar2;
        if (0 < (int)uStack_88) {
          uVar13 = 0;
          do {
            memory[-8] = 0xb6;
            memory[-7] = '\x1a';
            memory[-6] = '\x10';
            memory[-5] = '\0';
            memory[-4] = '\0';
            memory[-3] = '\0';
            memory[-2] = '\0';
            memory[-1] = '\0';
            iVar7 = rand();
            memory[uVar13] = (byte)iVar7 & bVar6;
            uVar13 = uVar13 + 1;
          } while (uVar9 != uVar13);
        }
        uVar9 = uStack_88;
        memory[-8] = 0xdd;
        memory[-7] = '\x1a';
        memory[-6] = '\x10';
        memory[-5] = '\0';
        memory[-4] = '\0';
        memory[-3] = '\0';
        memory[-2] = '\0';
        memory[-1] = '\0';
        m256v_make(&mStack_140,(int)uVar9,8,memory);
        uVar8 = uStack_3c;
        memory[-8] = 0xf4;
        memory[-7] = '\x1a';
        memory[-6] = '\x10';
        memory[-5] = '\0';
        memory[-4] = '\0';
        memory[-3] = '\0';
        memory[-2] = '\0';
        memory[-1] = '\0';
        m256v_make(&mStack_110,uVar8,8,memory);
        lVar3 = -uStack_78;
        puVar10 = memory + lVar3;
        iVar7 = (int)uStack_48;
        puStack_e0 = puVar10;
        builtin_memcpy((uint8_t *)((long)pmVar11 + lVar3 + lVar2 + lVar1 + -8)," \x1b\x10",4);
        puVar10[-4] = '\0';
        puVar10[-3] = '\0';
        puVar10[-2] = '\0';
        puVar10[-1] = '\0';
        m256v_make(&mStack_170,iVar7,8,puVar10);
        builtin_memcpy((uint8_t *)((long)pmVar11 + lVar3 + lVar2 + lVar1 + -8),"6\x1b\x10",4);
        puVar10[-4] = '\0';
        puVar10[-3] = '\0';
        puVar10[-2] = '\0';
        puVar10[-1] = '\0';
        m256v_mul(&mStack_128,&mStack_110,&mStack_170);
        uVar8 = uStack_3c;
        lVar4 = -uStack_80;
        puVar10 = puVar10 + lVar4;
        builtin_memcpy((uint8_t *)((long)pmVar11 + lVar4 + lVar3 + lVar2 + lVar1 + -8),"U\x1b\x10",4
                      );
        puVar10[-4] = '\0';
        puVar10[-3] = '\0';
        puVar10[-2] = '\0';
        puVar10[-1] = '\0';
        m256v_make(&mStack_f8,iVar7,uVar8,puVar10);
        uVar9 = uStack_58;
        builtin_memcpy((uint8_t *)((long)pmVar11 + lVar4 + lVar3 + lVar2 + lVar1 + -8),"d\x1b\x10",4
                      );
        puVar10[-4] = '\0';
        puVar10[-3] = '\0';
        puVar10[-2] = '\0';
        puVar10[-1] = '\0';
        memcpy(puVar10,puVar15,uVar9);
        uStack_d8 = uStack_c0 * 4 + 0xf & 0xfffffffffffffff0;
        piVar14 = (int *)(puVar10 + -uStack_d8);
        cp = (int *)((long)piVar14 - uStack_b0);
        cp[-2] = 0x101ba6;
        cp[-1] = 0;
        m256v_LU_decomp_inplace(&mStack_f8,piVar14,cp);
        puVar15 = (uint8_t *)((long)cp - uStack_78);
        iVar7 = (int)uStack_48;
        piStack_a0 = cp;
        piStack_98 = piVar14;
        if ((byte)iStack_4c == '\0') {
          builtin_memcpy(puVar15 + -8,"%\x1c\x10",4);
          puVar15[-4] = '\0';
          puVar15[-3] = '\0';
          puVar15[-2] = '\0';
          puVar15[-1] = '\0';
          m256v_make(&mStack_158,iVar7,8,puVar15);
          pmVar11 = &mStack_110;
          builtin_memcpy(puVar15 + -8,"A\x1c\x10",4);
          puVar15[-4] = '\0';
          puVar15[-3] = '\0';
          puVar15[-2] = '\0';
          puVar15[-1] = '\0';
          m256v_LU_mult(&mStack_f8,piVar14,cp,pmVar11,&mStack_158);
          uVar9 = uStack_58;
          memory = puVar15;
        }
        else {
          inverted_out = (int *)(puVar15 + -uStack_d8);
          puStack_90 = puVar15;
          inverted_out[-2] = 0x101be4;
          inverted_out[-1] = 0;
          perm_invert(iVar7,piVar14,inverted_out);
          uVar9 = uStack_58;
          pmVar11 = &mStack_140;
          inverted_out[-2] = 0x101c01;
          inverted_out[-1] = 0;
          m256v_LU_mult_inplace(&mStack_f8,inverted_out,cp,pmVar11);
          puVar15 = puStack_90;
        }
        uVar13 = uStack_c8;
        puVar10 = puStack_e0;
        builtin_memcpy(puVar15 + -8,"[\x1c\x10",4);
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        iVar7 = bcmp(puVar10,memory,uVar13);
        uVar13 = (ulong)uStack_3c;
        if (iVar7 != 0) break;
        uVar8 = (uint)uStack_68 + 1;
        uStack_a8 = CONCAT71((int7)((ulong)pmVar11 >> 8),0x270e < (uint)uStack_68);
        uStack_68 = (ulong)uVar8;
        pmVar11 = (m256v *)puStack_70;
        if (uVar8 == 10000) {
          bVar6 = 1;
LAB_00101c85:
          return bVar6 & 1;
        }
      }
      uVar12 = (ulong)(byte)iStack_4c;
      iVar7 = (int)uStack_48;
      uVar9 = uStack_48 & 0xffffffff;
      *(ulong *)(puVar15 + -0x10) = uStack_68;
      puVar15[-0x18] = 199;
      puVar15[-0x17] = '\x1c';
      puVar15[-0x16] = '\x10';
      puVar15[-0x15] = '\0';
      puVar15[-0x14] = '\0';
      puVar15[-0x13] = '\0';
      puVar15[-0x12] = '\0';
      puVar15[-0x11] = '\0';
      fprintf(_stderr,"Error:  A*X != PLUQ*X. (inplace=%d, n_row=%d, n_col=%d, field=%d, it=%d)\n",
              uVar12,uVar9,uVar13,(ulong)uStack_5c);
      puVar15[-8] = 0xe4;
      puVar15[-7] = '\x1c';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        Details about the test case:\n",0x25,1,_stderr);
      puVar15[-8] = 0xfd;
      puVar15[-7] = '\x1c';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        rp = ",0xd,1,_stderr);
      piVar14 = piStack_98;
      puVar15[-8] = '\x0f';
      puVar15[-7] = '\x1d';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      print_int_arr((FILE *)_stderr,iVar7,piVar14);
      puVar15[-8] = '(';
      puVar15[-7] = '\x1d';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        cp = ",0xd,1,_stderr);
      piVar14 = piStack_a0;
      puVar15[-8] = ':';
      puVar15[-7] = '\x1d';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      print_int_arr((FILE *)_stderr,uStack_3c,piVar14);
      puVar15[-8] = 'S';
      puVar15[-7] = '\x1d';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        matrix A:\n",0x12,1,_stderr);
      puVar15[-8] = 'b';
      puVar15[-7] = '\x1d';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      print_mat((FILE *)_stderr,(char *)&mStack_128,M);
      puVar15[-8] = '{';
      puVar15[-7] = '\x1d';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      fwrite("        matrix LU:\n",0x13,1,_stderr);
      puVar15[-8] = 0x8a;
      puVar15[-7] = '\x1d';
      puVar15[-6] = '\x10';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      print_mat((FILE *)_stderr,(char *)&mStack_f8,M_00);
      bVar6 = (byte)uStack_a8;
      goto LAB_00101c85;
    }
    uVar5 = 0xff;
  }
  return uVar5;
}

Assistant:

UNUSED
static uint8_t get_mask(int field)
{
	switch(field) {
	case 2:		return 0x1;	break;
	case 256:	return 0xff;	break;
	default:
		fprintf(stderr, "%s:%d: Unsupported field size %d.\n",
			__FILE__, __LINE__, field);
		exit(EXIT_FAILURE);
	}
	return 0; // Not reached.
}